

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::logTestInfoIter(CopyImageTest *this)

{
  ostringstream *this_00;
  TestLog *log;
  char *pcVar1;
  ScopedLogSection srcSection;
  ScopedLogSection section;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  ScopedLogSection local_1c8;
  string local_1c0;
  ScopedLogSection local_1a0;
  undefined1 local_198 [384];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"TestCaseInfo",(allocator<char> *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"Test case info",&local_1ca);
  tcu::ScopedLogSection::ScopedLogSection(&local_1a0,log,(string *)local_198,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)local_198);
  this_00 = (ostringstream *)(local_198 + 8);
  local_198._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Testing copying from ");
  pcVar1 = targetToName((this->m_srcImageInfo).m_target);
  std::operator<<((ostream *)this_00,pcVar1);
  std::operator<<((ostream *)this_00," to ");
  pcVar1 = targetToName((this->m_dstImageInfo).m_target);
  std::operator<<((ostream *)this_00,pcVar1);
  std::operator<<((ostream *)this_00,".");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Source image info.",&local_1ca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"Source image info.",&local_1c9);
  tcu::ScopedLogSection::ScopedLogSection(&local_1c8,log,(string *)local_198,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)local_198);
  logTestImageInfo(log,&this->m_srcImageInfo);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Destination image info.",&local_1ca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"Destination image info.",&local_1c9);
  tcu::ScopedLogSection::ScopedLogSection(&local_1c8,log,(string *)local_198,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)local_198);
  logTestImageInfo(log,&this->m_dstImageInfo);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1c8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_1a0);
  return;
}

Assistant:

void CopyImageTest::logTestInfoIter (void)
{
	TestLog& log = m_testCtx.getLog();

	logTestInfo(log, m_srcImageInfo, m_dstImageInfo);
}